

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void expand_right_edge(JSAMPARRAY image_data,int num_rows,JDIMENSION input_cols,
                      JDIMENSION output_cols)

{
  JSAMPLE JVar1;
  int numcols;
  int row;
  int count;
  JSAMPLE pixval;
  JSAMPROW ptr;
  JDIMENSION output_cols_local;
  JDIMENSION input_cols_local;
  int num_rows_local;
  JSAMPARRAY image_data_local;
  
  if (0 < (int)(output_cols - input_cols)) {
    for (row = 0; row < num_rows; row = row + 1) {
      JVar1 = (image_data[row] + input_cols)[-1];
      ptr = image_data[row] + input_cols;
      for (count = output_cols - input_cols; 0 < count; count = count + -1) {
        *ptr = JVar1;
        ptr = ptr + 1;
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
expand_right_edge (JSAMPARRAY image_data, int num_rows,
		   JDIMENSION input_cols, JDIMENSION output_cols)
{
  register JSAMPROW ptr;
  register JSAMPLE pixval;
  register int count;
  int row;
  int numcols = (int) (output_cols - input_cols);

  if (numcols > 0) {
    for (row = 0; row < num_rows; row++) {
      ptr = image_data[row] + input_cols;
      pixval = ptr[-1];		/* don't need GETJSAMPLE() here */
      for (count = numcols; count > 0; count--)
	*ptr++ = pixval;
    }
  }
}